

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

bool __thiscall
semver::detail::range_comparator<int,_int,_int>::contains
          (range_comparator<int,_int,_int> *this,version<int,_int,_int> *other)

{
  int iVar1;
  version<int,_int,_int> *other_local;
  range_comparator<int,_int,_int> *this_local;
  
  switch(this->op) {
  case less:
    iVar1 = compare_parsed<int,int,int>(other,&this->v,include_prerelease);
    this_local._7_1_ = iVar1 < 0;
    break;
  case less_or_equal:
    iVar1 = compare_parsed<int,int,int>(other,&this->v,include_prerelease);
    this_local._7_1_ = iVar1 < 1;
    break;
  case greater:
    iVar1 = compare_parsed<int,int,int>(other,&this->v,include_prerelease);
    this_local._7_1_ = 0 < iVar1;
    break;
  case greater_or_equal:
    iVar1 = compare_parsed<int,int,int>(other,&this->v,include_prerelease);
    this_local._7_1_ = -1 < iVar1;
    break;
  case equal:
    iVar1 = compare_parsed<int,int,int>(other,&this->v,include_prerelease);
    this_local._7_1_ = iVar1 == 0;
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

SEMVER_CONSTEXPR bool contains(const version<I1, I2, I3>& other) const noexcept {
      switch (op) {
      case range_operator::less:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) < 0;
      case range_operator::less_or_equal:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) <= 0;
      case range_operator::greater:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) > 0;
      case range_operator::greater_or_equal:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) >= 0;
      case range_operator::equal:
        return detail::compare_parsed(other, v, version_compare_option::include_prerelease) == 0;
      }
      return false;
    }